

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vk_mem_alloc.h
# Opt level: O3

VkResult vmaAllocateMemoryPages
                   (VmaAllocator allocator,VkMemoryRequirements *pVkMemoryRequirements,
                   VmaAllocationCreateInfo *pCreateInfo,size_t allocationCount,
                   VmaAllocation *pAllocations,VmaAllocationInfo *pAllocationInfo)

{
  VkResult VVar1;
  size_t i;
  size_t sVar2;
  
  if (allocationCount == 0) {
    VVar1 = VK_SUCCESS;
  }
  else {
    VVar1 = VmaAllocator_T::AllocateMemory
                      (allocator,pVkMemoryRequirements,false,false,(VkBuffer)0x0,(VkImage)0x0,
                       0xffffffff,pCreateInfo,VMA_SUBALLOCATION_TYPE_UNKNOWN,allocationCount,
                       pAllocations);
    if (VVar1 == VK_SUCCESS && pAllocationInfo != (VmaAllocationInfo *)0x0) {
      VVar1 = VK_SUCCESS;
      sVar2 = 0;
      do {
        VmaAllocator_T::GetAllocationInfo(allocator,pAllocations[sVar2],pAllocationInfo);
        sVar2 = sVar2 + 1;
        pAllocationInfo = pAllocationInfo + 1;
      } while (allocationCount != sVar2);
    }
  }
  return VVar1;
}

Assistant:

VMA_CALL_PRE VkResult VMA_CALL_POST vmaAllocateMemoryPages(
    VmaAllocator allocator,
    const VkMemoryRequirements* pVkMemoryRequirements,
    const VmaAllocationCreateInfo* pCreateInfo,
    size_t allocationCount,
    VmaAllocation* pAllocations,
    VmaAllocationInfo* pAllocationInfo)
{
    if(allocationCount == 0)
    {
        return VK_SUCCESS;
    }

    VMA_ASSERT(allocator && pVkMemoryRequirements && pCreateInfo && pAllocations);

    VMA_DEBUG_LOG("vmaAllocateMemoryPages");

    VMA_DEBUG_GLOBAL_MUTEX_LOCK

    VkResult result = allocator->AllocateMemory(
        *pVkMemoryRequirements,
        false, // requiresDedicatedAllocation
        false, // prefersDedicatedAllocation
        VK_NULL_HANDLE, // dedicatedBuffer
        VK_NULL_HANDLE, // dedicatedImage
        UINT32_MAX, // dedicatedBufferImageUsage
        *pCreateInfo,
        VMA_SUBALLOCATION_TYPE_UNKNOWN,
        allocationCount,
        pAllocations);

    if(pAllocationInfo != VMA_NULL && result == VK_SUCCESS)
    {
        for(size_t i = 0; i < allocationCount; ++i)
        {
            allocator->GetAllocationInfo(pAllocations[i], pAllocationInfo + i);
        }
    }

    return result;
}